

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeRollback(Btree *p,int tripCode)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  BtShared *pBVar4;
  Pgno PVar5;
  MemPage *pPage1;
  MemPage *local_20;
  
  pBVar4 = p->pBt;
  sqlite3BtreeEnter(p);
  if (tripCode == 0) {
    tripCode = saveAllCursors(pBVar4,0,(BtCursor *)0x0);
    if (tripCode == 0) goto LAB_0011fa58;
  }
  sqlite3BtreeTripAllCursors(p,tripCode);
LAB_0011fa58:
  if (p->inTrans == '\x02') {
    sqlite3PagerRollback(pBVar4->pPager);
    iVar3 = btreeGetPage(pBVar4,1,&local_20,0,0);
    if (iVar3 == 0) {
      uVar2 = *(uint *)(local_20->aData + 0x1c);
      PVar5 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      if (PVar5 == 0) {
        PVar5 = pBVar4->pPager->dbSize;
      }
      pBVar4->nPage = PVar5;
      sqlite3PagerUnref(local_20->pDbPage);
    }
    pBVar4->inTransaction = '\x01';
    sqlite3BitvecDestroy(pBVar4->pHasContent);
    pBVar4->pHasContent = (Bitvec *)0x0;
  }
  btreeEndTransaction(p);
  iVar3 = extraout_EAX;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      pBVar4 = p->pBt;
      if (pBVar4->mutex != (sqlite3_mutex *)0x0) {
        pBVar4 = (BtShared *)(*sqlite3Config.mutex.xMutexLeave)(pBVar4->mutex);
      }
      iVar3 = (int)pBVar4;
      p->locked = '\0';
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeRollback(Btree *p, int tripCode){
  int rc;
  BtShared *pBt = p->pBt;
  MemPage *pPage1;

  sqlite3BtreeEnter(p);
  if( tripCode==SQLITE_OK ){
    rc = tripCode = saveAllCursors(pBt, 0, 0);
  }else{
    rc = SQLITE_OK;
  }
  if( tripCode ){
    sqlite3BtreeTripAllCursors(p, tripCode);
  }
  btreeIntegrity(p);

  if( p->inTrans==TRANS_WRITE ){
    int rc2;

    assert( TRANS_WRITE==pBt->inTransaction );
    rc2 = sqlite3PagerRollback(pBt->pPager);
    if( rc2!=SQLITE_OK ){
      rc = rc2;
    }

    /* The rollback may have destroyed the pPage1->aData value.  So
    ** call btreeGetPage() on page 1 again to make
    ** sure pPage1->aData is set correctly. */
    if( btreeGetPage(pBt, 1, &pPage1, 0, 0)==SQLITE_OK ){
      int nPage = get4byte(28+(u8*)pPage1->aData);
      testcase( nPage==0 );
      if( nPage==0 ) sqlite3PagerPagecount(pBt->pPager, &nPage);
      testcase( pBt->nPage!=nPage );
      pBt->nPage = nPage;
      releasePage(pPage1);
    }
    assert( countValidCursors(pBt, 1)==0 );
    pBt->inTransaction = TRANS_READ;
    btreeClearHasContent(pBt);
  }

  btreeEndTransaction(p);
  sqlite3BtreeLeave(p);
  return rc;
}